

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O3

Trivia __thiscall
slang::parsing::Preprocessor::handleBeginKeywordsDirective(Preprocessor *this,Token directive)

{
  iterator __position;
  BeginKeywordsDirectiveSyntax *syntax;
  SourceRange range;
  optional<slang::parsing::KeywordVersion> versionOpt;
  undefined1 in_stack_00000008 [16];
  Token versionToken;
  _Optional_payload_base<slang::parsing::KeywordVersion> local_3a;
  Token local_38;
  Token local_28;
  Trivia local_18;
  
  local_28.info = directive.info;
  local_28._0_8_ = directive._0_8_;
  checkOutsideDesignElement(this,directive);
  local_38 = expect(this,StringLiteral);
  if ((local_38._0_4_ >> 0x10 & 1) == 0) {
    Token::valueText(&local_38);
    local_3a = (_Optional_payload_base<slang::parsing::KeywordVersion>)
               LexerFacts::getKeywordVersion((string_view)in_stack_00000008);
    if (((ushort)local_3a >> 8 & 1) == 0) {
      range = Token::range(&local_38);
      Diagnostics::add(this->diagnostics,(DiagCode)0x1b0004,range);
    }
    else {
      __position._M_current =
           (this->keywordVersionStack).
           super__Vector_base<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->keywordVersionStack).
          super__Vector_base<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<slang::parsing::KeywordVersion,std::allocator<slang::parsing::KeywordVersion>>::
        _M_realloc_insert<slang::parsing::KeywordVersion_const&>
                  ((vector<slang::parsing::KeywordVersion,std::allocator<slang::parsing::KeywordVersion>>
                    *)&this->keywordVersionStack,__position,(KeywordVersion *)&local_3a);
      }
      else {
        *__position._M_current = (KeywordVersion)local_3a._M_payload;
        (this->keywordVersionStack).
        super__Vector_base<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_>
        ._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
    }
  }
  syntax = BumpAllocator::
           emplace<slang::syntax::BeginKeywordsDirectiveSyntax,slang::parsing::Token&,slang::parsing::Token&>
                     (this->alloc,&local_28,&local_38);
  Trivia::Trivia(&local_18,Directive,(SyntaxNode *)syntax);
  return local_18;
}

Assistant:

Trivia Preprocessor::handleBeginKeywordsDirective(Token directive) {
    checkOutsideDesignElement(directive);

    Token versionToken = expect(TokenKind::StringLiteral);
    if (!versionToken.isMissing()) {
        auto versionOpt = LF::getKeywordVersion(versionToken.valueText());
        if (!versionOpt)
            addDiag(diag::UnrecognizedKeywordVersion, versionToken.range());
        else
            keywordVersionStack.push_back(*versionOpt);
    }

    auto result = alloc.emplace<BeginKeywordsDirectiveSyntax>(directive, versionToken);
    return Trivia(TriviaKind::Directive, result);
}